

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<Assimp::FIBoolValue> __thiscall
Assimp::FIBoolValue::create(FIBoolValue *this,vector<bool,_std::allocator<bool>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Assimp::FIBoolValue> sVar1;
  shared_ptr<Assimp::FIBoolValueImpl> local_28;
  vector<bool,_std::allocator<bool>_> *local_18;
  vector<bool,_std::allocator<bool>_> *value_local;
  
  local_18 = value;
  value_local = (vector<bool,_std::allocator<bool>_> *)this;
  std::make_shared<Assimp::FIBoolValueImpl,std::vector<bool,std::allocator<bool>>>
            ((vector<bool,_std::allocator<bool>_> *)&local_28);
  std::shared_ptr<Assimp::FIBoolValue>::shared_ptr<Assimp::FIBoolValueImpl,void>
            ((shared_ptr<Assimp::FIBoolValue> *)this,&local_28);
  std::shared_ptr<Assimp::FIBoolValueImpl>::~shared_ptr(&local_28);
  sVar1.super___shared_ptr<Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FIBoolValue>)
         sVar1.super___shared_ptr<Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIBoolValue> FIBoolValue::create(std::vector<bool> &&value) {
    return std::make_shared<FIBoolValueImpl>(std::move(value));
}